

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O1

PrimInfoMB * __thiscall
embree::sse2::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::sse2::CurveGeometryInterface,_embree::CatmullRomCurveT>
::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)2,_embree::sse2::CurveGeometryInterface,_embree::CatmullRomCurveT>
          *this,mvector<PrimRefMB> *prims,BBox1f *t0t1,range<unsigned_long> *r,size_t k,uint geomID)

{
  float *pfVar1;
  undefined1 (*pauVar2) [12];
  BBox1f BVar3;
  BufferView<embree::Vec3fx> *pBVar4;
  BufferView<embree::Vec3fa> *pBVar5;
  char *pcVar6;
  PrimRefMB *pPVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar16;
  long lVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  long lVar22;
  int iVar23;
  undefined4 uVar24;
  BufferView<embree::Vec3fa> *pBVar25;
  uint uVar26;
  long lVar27;
  int i;
  size_t sVar28;
  ulong uVar29;
  bool bVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  undefined1 auVar41 [12];
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar63;
  float fVar70;
  undefined1 auVar73 [12];
  float fVar84;
  Vec3fa n0;
  float fVar87;
  undefined1 auVar74 [16];
  float fVar71;
  float fVar72;
  float fVar85;
  float fVar86;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar83;
  float fVar92;
  float fVar102;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar106;
  float fVar107;
  float fVar115;
  float fVar116;
  float fVar117;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar110;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar114;
  float fVar121;
  float fVar122;
  Vec3ff v3;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar120;
  float fVar123;
  float fVar124;
  uint uVar125;
  undefined1 auVar126 [12];
  float fVar133;
  float fVar134;
  float fVar135;
  uint uVar136;
  float fVar137;
  float fVar138;
  uint uVar139;
  uint uVar140;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar131;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar132;
  float fVar141;
  float fVar142;
  undefined1 auVar143 [12];
  float fVar149;
  float fVar150;
  float fVar151;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar148;
  float fVar152;
  float fVar157;
  float fVar158;
  vfloat4 a_1;
  float fVar159;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar160;
  float fVar161;
  float fVar166;
  float fVar167;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  undefined1 auVar171 [16];
  float fVar179;
  uint uVar180;
  uint uVar183;
  uint uVar184;
  uint uVar185;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  float fVar189;
  float fVar190;
  Vec3fa n1;
  undefined1 auVar188 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  undefined1 local_3a8 [8];
  undefined8 uStack_3a0;
  float local_390;
  float local_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_358;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_348;
  undefined1 local_328 [16];
  uint local_318;
  uint uStack_314;
  uint uStack_310;
  uint uStack_30c;
  ulong local_2f8;
  unsigned_long local_288;
  size_t local_280;
  size_t local_278;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_248;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_238;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_228;
  BBox1f local_218;
  anon_class_16_2_07cfa4d6 local_f0;
  ulong local_e0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_d8;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_b8;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  ulong uVar17;
  
  local_228 = _DAT_01feb9f0;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = _DAT_01feb9f0;
  local_238 = _DAT_01feba00;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = _DAT_01feba00;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = local_228;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = local_238;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = local_228;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = local_238;
  (__return_storage_ptr__->object_range)._begin = 0;
  (__return_storage_ptr__->object_range)._end = 0;
  (__return_storage_ptr__->max_time_range).lower = 0.0;
  __return_storage_ptr__->num_time_segments = 0;
  __return_storage_ptr__->max_num_time_segments = 0;
  *(undefined1 **)&(__return_storage_ptr__->max_time_range).upper = &DAT_3f8000003f800000;
  (__return_storage_ptr__->time_range).upper = 0.0;
  uVar29 = r->_begin;
  local_390 = (__return_storage_ptr__->time_range).lower;
  local_38c = 0.0;
  local_280 = __return_storage_ptr__->num_time_segments;
  local_2f8 = __return_storage_ptr__->max_num_time_segments;
  local_218 = __return_storage_ptr__->max_time_range;
  local_248 = local_238;
  aVar114 = local_228;
  aVar120 = local_238;
  aVar132 = local_228;
  if (uVar29 < r->_end) {
    local_288 = (__return_storage_ptr__->object_range)._end;
    local_278 = k;
    do {
      BVar3 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
              super_Geometry.time_range;
      fVar16 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
               super_Geometry.fnumTimeSegments;
      fVar40 = t0t1->lower;
      fVar39 = t0t1->upper;
      fVar32 = BVar3.lower;
      fVar92 = BVar3.upper - fVar32;
      fVar31 = floorf(((fVar40 - fVar32) / fVar92) * 1.0000002 * fVar16);
      fVar32 = ceilf(((fVar39 - fVar32) / fVar92) * 0.99999976 * fVar16);
      uVar26 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                   super_CurveGeometry.super_Geometry.field_0x58 +
                        *(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                  super_CurveGeometry.field_0x68 * uVar29);
      uVar17 = (ulong)(uVar26 + 3);
      pBVar4 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
               vertices.items;
      if (uVar17 < (pBVar4->super_RawBufferView).num) {
        fVar92 = 0.0;
        if (0.0 <= fVar31) {
          fVar92 = fVar31;
        }
        uVar19 = (uint)fVar92;
        if (fVar16 <= fVar32) {
          fVar32 = fVar16;
        }
        uVar21 = (uint)fVar32;
        bVar30 = uVar21 < uVar19;
        if (uVar19 <= uVar21) {
          uVar20 = (ulong)(int)uVar19;
          pBVar5 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                   super_CurveGeometry.normals.items;
          fVar32 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                   super_CurveGeometry.maxRadiusScale;
          pBVar25 = pBVar5;
          do {
            pcVar6 = pBVar4[uVar20].super_RawBufferView.ptr_ofs;
            sVar28 = pBVar4[uVar20].super_RawBufferView.stride;
            lVar18 = sVar28 * uVar26;
            lVar22 = sVar28 * (uVar26 + 1);
            lVar27 = sVar28 * (uVar26 + 2);
            fVar31 = (float)DAT_01ff0930;
            fVar92 = DAT_01ff0930._4_4_;
            fVar107 = DAT_01ff0930._8_4_;
            fVar159 = DAT_01ff0930._12_4_;
            auVar74._4_4_ = -(uint)(fVar92 <= ABS(*(float *)(pcVar6 + lVar22 + 0xc)));
            auVar74._0_4_ = -(uint)(fVar31 <= ABS(*(float *)(pcVar6 + lVar18 + 0xc)));
            auVar74._8_4_ = -(uint)(fVar107 <= ABS(*(float *)(pcVar6 + lVar27 + 0xc)));
            auVar74._12_4_ = -(uint)(fVar159 <= ABS(*(float *)(pcVar6 + sVar28 * uVar17 + 0xc)));
            iVar23 = movmskps((int)pBVar25,auVar74);
            if (iVar23 != 0) {
LAB_00ab6d23:
              if (!bVar30) goto LAB_00ab72b0;
              break;
            }
            pfVar1 = (float *)(pcVar6 + lVar18);
            fVar70 = *pfVar1;
            fVar84 = pfVar1[1];
            fVar87 = pfVar1[2];
            fVar33 = pfVar1[3];
            auVar162._0_4_ = -(uint)(fVar70 < fVar31 && -1.844e+18 < fVar70);
            auVar162._4_4_ = -(uint)(fVar84 < fVar92 && -1.844e+18 < fVar84);
            auVar162._8_4_ = -(uint)(fVar87 < fVar107 && -1.844e+18 < fVar87);
            auVar162._12_4_ = -(uint)(fVar33 < fVar159 && -1.844e+18 < fVar33);
            uVar24 = movmskps(0,auVar162);
            pBVar25 = (BufferView<embree::Vec3fa> *)
                      (ulong)CONCAT31((int3)((uint)uVar24 >> 8),~(byte)uVar24);
            if ((~(byte)uVar24 & 7) != 0) goto LAB_00ab6d23;
            pfVar1 = (float *)(pcVar6 + lVar22);
            fVar133 = *pfVar1;
            fVar137 = pfVar1[1];
            fVar102 = pfVar1[2];
            fVar34 = pfVar1[3];
            auVar75._0_4_ = -(uint)(fVar133 < fVar31 && -1.844e+18 < fVar133);
            auVar75._4_4_ = -(uint)(fVar137 < fVar92 && -1.844e+18 < fVar137);
            auVar75._8_4_ = -(uint)(fVar102 < fVar107 && -1.844e+18 < fVar102);
            auVar75._12_4_ = -(uint)(fVar34 < fVar159 && -1.844e+18 < fVar34);
            uVar24 = movmskps((int)lVar22,auVar75);
            if ((~(byte)uVar24 & 7) != 0) goto LAB_00ab6d23;
            pauVar2 = (undefined1 (*) [12])(pcVar6 + lVar27);
            fVar121 = *(float *)*pauVar2;
            fVar122 = *(float *)(*pauVar2 + 4);
            fVar123 = *(float *)(*pauVar2 + 8);
            auVar126 = *pauVar2;
            fVar35 = *(float *)pauVar2[1];
            auVar93._0_4_ = -(uint)(fVar121 < fVar31 && -1.844e+18 < fVar121);
            auVar93._4_4_ = -(uint)(fVar122 < fVar92 && -1.844e+18 < fVar122);
            auVar93._8_4_ = -(uint)(fVar123 < fVar107 && -1.844e+18 < fVar123);
            auVar93._12_4_ = -(uint)(fVar35 < fVar159 && -1.844e+18 < fVar35);
            uVar24 = movmskps(CONCAT31((int3)((uint)uVar24 >> 8),~(byte)uVar24),auVar93);
            if ((~(byte)uVar24 & 7) != 0) goto LAB_00ab6d23;
            pfVar1 = (float *)(pcVar6 + sVar28 * uVar17);
            fVar124 = *pfVar1;
            fVar134 = pfVar1[1];
            fVar135 = pfVar1[2];
            fVar36 = pfVar1[3];
            auVar94._0_4_ = -(uint)(fVar124 < fVar31 && -1.844e+18 < fVar124);
            auVar94._4_4_ = -(uint)(fVar134 < fVar92 && -1.844e+18 < fVar134);
            auVar94._8_4_ = -(uint)(fVar135 < fVar107 && -1.844e+18 < fVar135);
            auVar94._12_4_ = -(uint)(fVar36 < fVar159 && -1.844e+18 < fVar36);
            uVar24 = movmskps(CONCAT31((int3)((uint)uVar24 >> 8),~(byte)uVar24),auVar94);
            if ((~(byte)uVar24 & 7) != 0) goto LAB_00ab6d23;
            pcVar6 = pBVar5[uVar20].super_RawBufferView.ptr_ofs;
            sVar28 = pBVar5[uVar20].super_RawBufferView.stride;
            lVar18 = sVar28 * uVar26;
            pfVar1 = (float *)(pcVar6 + lVar18);
            fVar138 = *pfVar1;
            fVar142 = pfVar1[1];
            fVar173 = pfVar1[2];
            auVar186._0_4_ = -(uint)(fVar138 < fVar31 && -1.844e+18 < fVar138);
            auVar186._4_4_ = -(uint)(fVar142 < fVar92 && -1.844e+18 < fVar142);
            auVar186._8_4_ = -(uint)(fVar173 < fVar107 && -1.844e+18 < fVar173);
            auVar186._12_4_ = -(uint)(pfVar1[3] < fVar159 && -1.844e+18 < pfVar1[3]);
            uVar24 = movmskps((int)lVar18,auVar186);
            if ((~(byte)uVar24 & 7) != 0) goto LAB_00ab6d23;
            lVar18 = sVar28 * (uVar26 + 1);
            pfVar1 = (float *)(pcVar6 + lVar18);
            fVar176 = *pfVar1;
            fVar169 = pfVar1[1];
            fVar152 = pfVar1[2];
            auVar188._0_4_ = -(uint)(fVar176 < fVar31 && -1.844e+18 < fVar176);
            auVar188._4_4_ = -(uint)(fVar169 < fVar92 && -1.844e+18 < fVar169);
            auVar188._8_4_ = -(uint)(fVar152 < fVar107 && -1.844e+18 < fVar152);
            auVar188._12_4_ = -(uint)(pfVar1[3] < fVar159 && -1.844e+18 < pfVar1[3]);
            uVar24 = movmskps((int)lVar18,auVar188);
            if ((~(byte)uVar24 & 7) != 0) goto LAB_00ab6d23;
            fVar33 = fVar33 * fVar32;
            fVar34 = fVar34 * fVar32;
            fVar35 = fVar35 * fVar32;
            fVar36 = fVar36 * fVar32;
            lVar18 = sVar28 * (uVar26 + 2);
            pfVar1 = (float *)(pcVar6 + lVar18);
            fVar157 = *pfVar1;
            fVar158 = pfVar1[1];
            fVar161 = pfVar1[2];
            pfVar1 = (float *)(pcVar6 + sVar28 * uVar17);
            fVar179 = *pfVar1;
            fVar189 = pfVar1[1];
            fVar190 = pfVar1[2];
            fVar106 = (fVar121 * 0.5 + fVar124 * 0.0 + fVar133 * 0.0) - fVar70 * 0.5;
            fVar115 = (fVar122 * 0.5 + fVar134 * 0.0 + fVar137 * 0.0) - fVar84 * 0.5;
            fVar116 = (fVar123 * 0.5 + fVar135 * 0.0 + fVar102 * 0.0) - fVar87 * 0.5;
            fVar117 = (fVar35 * 0.5 + fVar36 * 0.0 + fVar34 * 0.0) - fVar33 * 0.5;
            fVar160 = (fVar157 * 0.5 + fVar179 * 0.0 + fVar176 * 0.0) - fVar138 * 0.5;
            fVar166 = (fVar158 * 0.5 + fVar189 * 0.0 + fVar169 * 0.0) - fVar142 * 0.5;
            fVar167 = (fVar161 * 0.5 + fVar190 * 0.0 + fVar152 * 0.0) - fVar173 * 0.5;
            fVar37 = fVar121 * 0.0 + fVar124 * -0.0 + fVar133 + fVar70 * -0.0;
            fVar64 = fVar122 * 0.0 + fVar134 * -0.0 + fVar137 + fVar84 * -0.0;
            fVar66 = fVar123 * 0.0 + fVar135 * -0.0 + fVar102 + fVar87 * -0.0;
            fVar68 = fVar35 * 0.0 + fVar36 * -0.0 + fVar34 + fVar33 * -0.0;
            local_3a8._0_4_ = auVar126._0_4_;
            local_3a8._4_4_ = auVar126._4_4_;
            uStack_3a0._0_4_ = auVar126._8_4_;
            fVar168 = fVar157 * 0.0 + fVar179 * -0.0 + fVar176 + fVar138 * -0.0;
            fVar172 = fVar158 * 0.0 + fVar189 * -0.0 + fVar169 + fVar142 * -0.0;
            fVar175 = fVar161 * 0.0 + fVar190 * -0.0 + fVar152 + fVar173 * -0.0;
            fVar38 = fVar124 * -0.0 + (float)local_3a8._0_4_ + fVar133 * 0.0 + fVar70 * -0.0;
            fVar65 = fVar134 * -0.0 + (float)local_3a8._4_4_ + fVar137 * 0.0 + fVar84 * -0.0;
            fVar67 = fVar135 * -0.0 + (float)uStack_3a0 + fVar102 * 0.0 + fVar87 * -0.0;
            fVar69 = fVar36 * -0.0 + fVar35 + fVar34 * 0.0 + fVar33 * -0.0;
            fVar141 = fVar70 * 0.0 + ((fVar124 * 0.5 + fVar121 * 0.0) - fVar133 * 0.5);
            fVar149 = fVar84 * 0.0 + ((fVar134 * 0.5 + fVar122 * 0.0) - fVar137 * 0.5);
            fVar150 = fVar87 * 0.0 + ((fVar135 * 0.5 + fVar123 * 0.0) - fVar102 * 0.5);
            fVar151 = fVar33 * 0.0 + ((fVar36 * 0.5 + fVar35 * 0.0) - fVar34 * 0.5);
            fVar33 = fVar179 * -0.0 + fVar157 + fVar176 * 0.0 + fVar138 * -0.0;
            fVar133 = fVar189 * -0.0 + fVar158 + fVar169 * 0.0 + fVar142 * -0.0;
            fVar137 = fVar190 * -0.0 + fVar161 + fVar152 * 0.0 + fVar173 * -0.0;
            fVar70 = fVar138 * 0.0 + ((fVar179 * 0.5 + fVar157 * 0.0) - fVar176 * 0.5);
            fVar84 = fVar142 * 0.0 + ((fVar189 * 0.5 + fVar158 * 0.0) - fVar169 * 0.5);
            fVar87 = fVar173 * 0.0 + ((fVar190 * 0.5 + fVar161 * 0.0) - fVar152 * 0.5);
            fVar169 = fVar168 * fVar115 - fVar172 * fVar106;
            fVar173 = fVar172 * fVar116 - fVar175 * fVar115;
            fVar176 = fVar175 * fVar106 - fVar168 * fVar116;
            fVar34 = fVar115 * fVar160 - fVar166 * fVar106;
            fVar121 = fVar116 * fVar166 - fVar167 * fVar115;
            fVar122 = fVar106 * fVar167 - fVar160 * fVar116;
            fVar123 = fVar33 * fVar149 - fVar133 * fVar141;
            fVar134 = fVar133 * fVar150 - fVar137 * fVar149;
            fVar36 = fVar137 * fVar141 - fVar33 * fVar150;
            fVar33 = fVar149 * fVar70 - fVar84 * fVar141;
            fVar137 = fVar150 * fVar84 - fVar87 * fVar149;
            fVar102 = fVar141 * fVar87 - fVar70 * fVar150;
            fVar84 = fVar176 * fVar176 + fVar173 * fVar173 + fVar169 * fVar169;
            auVar162 = ZEXT416((uint)fVar84);
            auVar74 = rsqrtss(ZEXT416((uint)fVar84),auVar162);
            fVar70 = auVar74._0_4_;
            fVar87 = fVar70 * 1.5 - fVar70 * fVar70 * fVar84 * 0.5 * fVar70;
            fVar179 = fVar169 * fVar34 + fVar176 * fVar122 + fVar173 * fVar121;
            auVar74 = rcpss(auVar162,auVar162);
            fVar70 = (2.0 - fVar84 * auVar74._0_4_) * auVar74._0_4_;
            fVar142 = fVar36 * fVar36 + fVar134 * fVar134 + fVar123 * fVar123;
            auVar74 = ZEXT416((uint)fVar142);
            auVar162 = rsqrtss(ZEXT416((uint)fVar142),auVar74);
            fVar133 = auVar162._0_4_;
            fVar35 = fVar133 * 1.5 - fVar133 * fVar133 * fVar142 * 0.5 * fVar133;
            fVar161 = fVar123 * fVar33 + fVar36 * fVar102 + fVar134 * fVar137;
            auVar74 = rcpss(auVar74,auVar74);
            fVar133 = (2.0 - fVar142 * auVar74._0_4_) * auVar74._0_4_;
            fVar124 = fVar68 * fVar173 * fVar87;
            fVar135 = fVar68 * fVar176 * fVar87;
            fVar138 = fVar68 * fVar169 * fVar87;
            fVar152 = fVar37 - fVar124;
            fVar157 = fVar64 - fVar135;
            fVar158 = fVar66 - fVar138;
            fVar173 = fVar68 * fVar70 * (fVar84 * fVar121 - fVar179 * fVar173) * fVar87 +
                      fVar117 * fVar173 * fVar87;
            fVar176 = fVar68 * fVar70 * (fVar84 * fVar122 - fVar179 * fVar176) * fVar87 +
                      fVar117 * fVar176 * fVar87;
            fVar169 = fVar68 * fVar70 * (fVar84 * fVar34 - fVar179 * fVar169) * fVar87 +
                      fVar117 * fVar169 * fVar87;
            fVar70 = fVar69 * fVar134 * fVar35;
            fVar84 = fVar69 * fVar36 * fVar35;
            fVar87 = fVar69 * fVar123 * fVar35;
            fVar179 = fVar38 - fVar70;
            fVar189 = fVar65 - fVar84;
            fVar190 = fVar67 - fVar87;
            fVar34 = fVar69 * fVar133 * (fVar142 * fVar137 - fVar161 * fVar134) * fVar35 +
                     fVar151 * fVar134 * fVar35;
            fVar102 = fVar69 * fVar133 * (fVar142 * fVar102 - fVar161 * fVar36) * fVar35 +
                      fVar151 * fVar36 * fVar35;
            fVar121 = fVar69 * fVar133 * (fVar142 * fVar33 - fVar161 * fVar123) * fVar35 +
                      fVar151 * fVar123 * fVar35;
            fVar122 = (fVar106 - fVar173) * 0.33333334 + fVar152;
            fVar123 = (fVar115 - fVar176) * 0.33333334 + fVar157;
            fVar35 = (fVar116 - fVar169) * 0.33333334 + fVar158;
            fVar33 = fVar179 - (fVar141 - fVar34) * 0.33333334;
            fVar133 = fVar189 - (fVar149 - fVar102) * 0.33333334;
            fVar137 = fVar190 - (fVar150 - fVar121) * 0.33333334;
            lVar22 = 0;
            local_318 = 0x7f800000;
            uStack_314 = 0x7f800000;
            uStack_310 = 0x7f800000;
            uStack_30c = 0x7f800000;
            local_328._8_8_ = 0x7f8000007f800000;
            local_328._0_8_ = 0x7f8000007f800000;
            uStack_3a0 = 0x7f8000007f800000;
            local_3a8 = (undefined1  [8])0x7f8000007f800000;
            local_348.m128 = _DAT_01feba00;
            local_358.m128 = _DAT_01feba00;
            aVar110 = _DAT_01feba00;
            do {
              uVar19 = (uint)lVar22;
              lVar27 = lVar22 * 4;
              fVar134 = *(float *)(bezier_basis0 + lVar27 + 0x1dc);
              fVar36 = *(float *)(bezier_basis0 + lVar27 + 0x1e0);
              fVar142 = *(float *)(bezier_basis0 + lVar27 + 0x1e4);
              fVar161 = *(float *)(bezier_basis0 + lVar27 + 0x1e8);
              lVar27 = lVar22 * 4;
              fVar68 = *(float *)(bezier_basis0 + lVar27 + 0x660);
              fVar69 = *(float *)(bezier_basis0 + lVar27 + 0x664);
              fVar117 = *(float *)(bezier_basis0 + lVar27 + 0x668);
              fVar151 = *(float *)(bezier_basis0 + lVar27 + 0x66c);
              lVar27 = lVar22 * 4;
              fVar160 = *(float *)(bezier_basis0 + lVar27 + 0xae4);
              fVar166 = *(float *)(bezier_basis0 + lVar27 + 0xae8);
              fVar167 = *(float *)(bezier_basis0 + lVar27 + 0xaec);
              fVar168 = *(float *)(bezier_basis0 + lVar27 + 0xaf0);
              lVar27 = lVar22 * 4;
              fVar172 = *(float *)(bezier_basis0 + lVar27 + 0xf68);
              fVar175 = *(float *)(bezier_basis0 + lVar27 + 0xf6c);
              fVar8 = *(float *)(bezier_basis0 + lVar27 + 0xf70);
              fVar9 = *(float *)(bezier_basis0 + lVar27 + 0xf74);
              auVar144._0_4_ =
                   fVar152 * fVar134 + fVar122 * fVar68 + fVar33 * fVar160 + fVar179 * fVar172;
              auVar144._4_4_ =
                   fVar152 * fVar36 + fVar122 * fVar69 + fVar33 * fVar166 + fVar179 * fVar175;
              auVar144._8_4_ =
                   fVar152 * fVar142 + fVar122 * fVar117 + fVar33 * fVar167 + fVar179 * fVar8;
              auVar144._12_4_ =
                   fVar152 * fVar161 + fVar122 * fVar151 + fVar33 * fVar168 + fVar179 * fVar9;
              auVar153._0_4_ =
                   fVar157 * fVar134 + fVar123 * fVar68 + fVar133 * fVar160 + fVar189 * fVar172;
              auVar153._4_4_ =
                   fVar157 * fVar36 + fVar123 * fVar69 + fVar133 * fVar166 + fVar189 * fVar175;
              auVar153._8_4_ =
                   fVar157 * fVar142 + fVar123 * fVar117 + fVar133 * fVar167 + fVar189 * fVar8;
              auVar153._12_4_ =
                   fVar157 * fVar161 + fVar123 * fVar151 + fVar133 * fVar168 + fVar189 * fVar9;
              fVar71 = fVar134 * fVar158 + fVar68 * fVar35 + fVar160 * fVar137 + fVar172 * fVar190;
              fVar85 = fVar36 * fVar158 + fVar69 * fVar35 + fVar166 * fVar137 + fVar175 * fVar190;
              fVar88 = fVar142 * fVar158 + fVar117 * fVar35 + fVar167 * fVar137 + fVar8 * fVar190;
              fVar90 = fVar161 * fVar158 + fVar151 * fVar35 + fVar168 * fVar137 + fVar9 * fVar190;
              lVar27 = lVar22 * 4;
              fVar134 = *(float *)(bezier_basis0 + lVar27 + 0x13ec);
              fVar36 = *(float *)(bezier_basis0 + lVar27 + 0x13f0);
              fVar142 = *(float *)(bezier_basis0 + lVar27 + 0x13f4);
              fVar161 = *(float *)(bezier_basis0 + lVar27 + 0x13f8);
              lVar27 = lVar22 * 4;
              fVar68 = *(float *)(bezier_basis0 + lVar27 + 0x1870);
              fVar69 = *(float *)(bezier_basis0 + lVar27 + 0x1874);
              fVar117 = *(float *)(bezier_basis0 + lVar27 + 0x1878);
              fVar151 = *(float *)(bezier_basis0 + lVar27 + 0x187c);
              lVar27 = lVar22 * 4;
              fVar160 = *(float *)(bezier_basis0 + lVar27 + 0x1cf4);
              fVar166 = *(float *)(bezier_basis0 + lVar27 + 0x1cf8);
              fVar167 = *(float *)(bezier_basis0 + lVar27 + 0x1cfc);
              fVar168 = *(float *)(bezier_basis0 + lVar27 + 0x1d00);
              lVar27 = lVar22 * 4;
              fVar172 = *(float *)(bezier_basis0 + lVar27 + 0x2178);
              fVar175 = *(float *)(bezier_basis0 + lVar27 + 0x217c);
              fVar8 = *(float *)(bezier_basis0 + lVar27 + 0x2180);
              fVar9 = *(float *)(bezier_basis0 + lVar27 + 0x2184);
              fVar72 = fVar152 * fVar134 + fVar122 * fVar68 + fVar33 * fVar160 + fVar179 * fVar172;
              fVar86 = fVar152 * fVar36 + fVar122 * fVar69 + fVar33 * fVar166 + fVar179 * fVar175;
              fVar89 = fVar152 * fVar142 + fVar122 * fVar117 + fVar33 * fVar167 + fVar179 * fVar8;
              fVar91 = fVar152 * fVar161 + fVar122 * fVar151 + fVar33 * fVar168 + fVar179 * fVar9;
              fVar170 = fVar157 * fVar134 + fVar123 * fVar68 + fVar133 * fVar160 + fVar189 * fVar172
              ;
              fVar174 = fVar157 * fVar36 + fVar123 * fVar69 + fVar133 * fVar166 + fVar189 * fVar175;
              fVar177 = fVar157 * fVar142 + fVar123 * fVar117 + fVar133 * fVar167 + fVar189 * fVar8;
              fVar178 = fVar157 * fVar161 + fVar123 * fVar151 + fVar133 * fVar168 + fVar189 * fVar9;
              fVar134 = fVar134 * fVar158 + fVar68 * fVar35 + fVar160 * fVar137 + fVar172 * fVar190;
              fVar36 = fVar36 * fVar158 + fVar69 * fVar35 + fVar166 * fVar137 + fVar175 * fVar190;
              fVar142 = fVar142 * fVar158 + fVar117 * fVar35 + fVar167 * fVar137 + fVar8 * fVar190;
              fVar161 = fVar161 * fVar158 + fVar151 * fVar35 + fVar168 * fVar137 + fVar9 * fVar190;
              uVar125 = -(uint)(uVar19 == 0);
              uVar136 = -(uint)(uVar19 == 1);
              uVar139 = -(uint)(uVar19 == 2);
              uVar140 = -(uint)(uVar19 == 3);
              uVar180 = -(uint)(uVar19 == 7);
              uVar183 = -(uint)(uVar19 == 6);
              uVar184 = -(uint)(uVar19 == 5);
              uVar185 = -(uint)(uVar19 == 4);
              auVar186 = minps(_local_3a8,auVar144);
              auVar93 = maxps((undefined1  [16])local_358,auVar144);
              auVar145._0_8_ =
                   CONCAT44(auVar144._4_4_ - (float)(~uVar136 & (uint)fVar86) * 0.055555556,
                            auVar144._0_4_ - (float)(~uVar125 & (uint)fVar72) * 0.055555556);
              auVar145._8_4_ = auVar144._8_4_ - (float)(~uVar139 & (uint)fVar89) * 0.055555556;
              auVar145._12_4_ = auVar144._12_4_ - (float)(~uVar140 & (uint)fVar91) * 0.055555556;
              auVar191._0_4_ = (float)(~uVar180 & (uint)fVar170) * 0.055555556 + auVar153._0_4_;
              auVar191._4_4_ = (float)(~uVar183 & (uint)fVar174) * 0.055555556 + auVar153._4_4_;
              auVar191._8_4_ = (float)(~uVar184 & (uint)fVar177) * 0.055555556 + auVar153._8_4_;
              auVar191._12_4_ = (float)(~uVar185 & (uint)fVar178) * 0.055555556 + auVar153._12_4_;
              auVar94 = minps(local_328,auVar153);
              auVar188 = maxps((undefined1  [16])local_348,auVar153);
              auVar154._0_8_ =
                   CONCAT44(auVar153._4_4_ - (float)(~uVar136 & (uint)fVar174) * 0.055555556,
                            auVar153._0_4_ - (float)(~uVar125 & (uint)fVar170) * 0.055555556);
              auVar154._8_4_ = auVar153._8_4_ - (float)(~uVar139 & (uint)fVar177) * 0.055555556;
              auVar154._12_4_ = auVar153._12_4_ - (float)(~uVar140 & (uint)fVar178) * 0.055555556;
              auVar108._0_4_ = -(uint)(-0x7ffffff9 < (int)(uVar19 ^ 0x80000000));
              auVar108._4_4_ = -(uint)(-0x7ffffff9 < (int)(uVar19 ^ 0x80000000));
              auVar108._8_4_ = -(uint)(-0x7ffffff9 < (int)(uVar19 ^ 0x80000000));
              auVar108._12_4_ = -(uint)(-0x7ffffff9 < (int)(uVar19 ^ 0x80000000));
              auVar15._4_4_ = fVar85;
              auVar15._0_4_ = fVar71;
              auVar15._8_4_ = fVar88;
              auVar15._12_4_ = fVar90;
              auVar181._0_4_ = (float)(~uVar180 & (uint)fVar134) * 0.055555556 + fVar71;
              auVar181._4_4_ = (float)(~uVar183 & (uint)fVar36) * 0.055555556 + fVar85;
              auVar181._8_4_ = (float)(~uVar184 & (uint)fVar142) * 0.055555556 + fVar88;
              auVar181._12_4_ = (float)(~uVar185 & (uint)fVar161) * 0.055555556 + fVar90;
              auVar182._4_4_ = uStack_314;
              auVar182._0_4_ = local_318;
              auVar182._8_4_ = uStack_310;
              auVar182._12_4_ = uStack_30c;
              auVar75 = minps(auVar182,auVar15);
              auVar74 = maxps((undefined1  [16])aVar110,auVar15);
              auVar163._0_8_ =
                   CONCAT44(fVar85 - (float)(~uVar136 & (uint)fVar36) * 0.055555556,
                            fVar71 - (float)(~uVar125 & (uint)fVar134) * 0.055555556);
              auVar163._8_4_ = fVar88 - (float)(~uVar139 & (uint)fVar142) * 0.055555556;
              auVar163._12_4_ = fVar90 - (float)(~uVar140 & (uint)fVar161) * 0.055555556;
              auVar42._8_4_ = auVar145._8_4_;
              auVar42._0_8_ = auVar145._0_8_;
              auVar42._12_4_ = auVar145._12_4_;
              auVar187._4_4_ = (float)(~uVar183 & (uint)fVar86) * 0.055555556 + auVar144._4_4_;
              auVar187._0_4_ = (float)(~uVar180 & (uint)fVar72) * 0.055555556 + auVar144._0_4_;
              auVar187._8_4_ = (float)(~uVar184 & (uint)fVar89) * 0.055555556 + auVar144._8_4_;
              auVar187._12_4_ = (float)(~uVar185 & (uint)fVar91) * 0.055555556 + auVar144._12_4_;
              auVar162 = minps(auVar42,auVar187);
              auVar186 = minps(auVar186,auVar162);
              auVar43._8_4_ = auVar154._8_4_;
              auVar43._0_8_ = auVar154._0_8_;
              auVar43._12_4_ = auVar154._12_4_;
              auVar162 = minps(auVar43,auVar191);
              auVar94 = minps(auVar94,auVar162);
              auVar44._8_4_ = auVar163._8_4_;
              auVar44._0_8_ = auVar163._0_8_;
              auVar44._12_4_ = auVar163._12_4_;
              auVar162 = minps(auVar44,auVar181);
              auVar162 = minps(auVar75,auVar162);
              _local_3a8 = _local_3a8 & auVar108 | ~auVar108 & auVar186;
              auVar103._0_4_ = local_328._0_4_ & auVar108._0_4_;
              auVar103._4_4_ = local_328._4_4_ & auVar108._4_4_;
              auVar103._8_4_ = local_328._8_4_ & auVar108._8_4_;
              auVar103._12_4_ = local_328._12_4_ & auVar108._12_4_;
              local_328 = auVar103 | ~auVar108 & auVar94;
              local_318 = local_318 & auVar108._0_4_ | ~auVar108._0_4_ & auVar162._0_4_;
              uStack_314 = uStack_314 & auVar108._4_4_ | ~auVar108._4_4_ & auVar162._4_4_;
              uStack_310 = uStack_310 & auVar108._8_4_ | ~auVar108._8_4_ & auVar162._8_4_;
              uStack_30c = uStack_30c & auVar108._12_4_ | ~auVar108._12_4_ & auVar162._12_4_;
              auVar162 = maxps(auVar145,auVar187);
              auVar162 = maxps(auVar93,auVar162);
              auVar75 = maxps(auVar154,auVar191);
              auVar93 = maxps(auVar188,auVar75);
              auVar75 = maxps(auVar163,auVar181);
              auVar74 = maxps(auVar74,auVar75);
              uVar139 = (uint)local_358.m128[0] & auVar108._0_4_ | ~auVar108._0_4_ & auVar162._0_4_;
              uVar140 = (uint)local_358.m128[1] & auVar108._4_4_ | ~auVar108._4_4_ & auVar162._4_4_;
              uVar180 = (uint)local_358.m128[2] & auVar108._8_4_ | ~auVar108._8_4_ & auVar162._8_4_;
              local_358.m128[3] =
                   (float)((uint)local_358.m128[3] & auVar108._12_4_ |
                          ~auVar108._12_4_ & auVar162._12_4_);
              local_358.m128[1] = (float)uVar140;
              local_358.m128[0] = (float)uVar139;
              local_358.m128[2] = (float)uVar180;
              uVar19 = (uint)local_348.m128[0] & auVar108._0_4_ | ~auVar108._0_4_ & auVar93._0_4_;
              uVar125 = (uint)local_348.m128[1] & auVar108._4_4_ | ~auVar108._4_4_ & auVar93._4_4_;
              uVar136 = (uint)local_348.m128[2] & auVar108._8_4_ | ~auVar108._8_4_ & auVar93._8_4_;
              local_348.m128[3] =
                   (float)((uint)local_348.m128[3] & auVar108._12_4_ |
                          ~auVar108._12_4_ & auVar93._12_4_);
              local_348.m128[1] = (float)uVar125;
              local_348.m128[0] = (float)uVar19;
              local_348.m128[2] = (float)uVar136;
              local_388 = aVar110.m128[0];
              fStack_384 = aVar110.m128[1];
              fStack_380 = aVar110.m128[2];
              fStack_37c = aVar110.m128[3];
              auVar45._0_4_ = (uint)local_388 & auVar108._0_4_;
              auVar45._4_4_ = (uint)fStack_384 & auVar108._4_4_;
              auVar45._8_4_ = (uint)fStack_380 & auVar108._8_4_;
              auVar45._12_4_ = (uint)fStack_37c & auVar108._12_4_;
              auVar109._0_4_ = ~auVar108._0_4_ & auVar74._0_4_;
              auVar109._4_4_ = ~auVar108._4_4_ & auVar74._4_4_;
              auVar109._8_4_ = ~auVar108._8_4_ & auVar74._8_4_;
              auVar109._12_4_ = ~auVar108._12_4_ & auVar74._12_4_;
              aVar110 = (anon_union_16_2_47237d3f_for_Vec3fa_0)(auVar109 | auVar45);
              lVar22 = lVar22 + 4;
            } while (lVar22 == 4);
            fVar37 = fVar37 + fVar124;
            fVar64 = fVar64 + fVar135;
            fVar66 = fVar66 + fVar138;
            fVar38 = fVar38 + fVar70;
            fVar65 = fVar65 + fVar84;
            fVar67 = fVar67 + fVar87;
            fVar70 = (fVar173 + fVar106) * 0.33333334 + fVar37;
            fVar84 = (fVar176 + fVar115) * 0.33333334 + fVar64;
            fVar87 = (fVar169 + fVar116) * 0.33333334 + fVar66;
            fVar33 = fVar38 - (fVar34 + fVar141) * 0.33333334;
            fVar133 = fVar65 - (fVar102 + fVar149) * 0.33333334;
            fVar137 = fVar67 - (fVar121 + fVar150) * 0.33333334;
            auVar46._4_4_ = local_3a8._0_4_;
            auVar46._0_4_ = local_3a8._4_4_;
            auVar46._8_4_ = local_3a8._12_4_;
            auVar46._12_4_ = local_3a8._8_4_;
            auVar74 = minps(auVar46,_local_3a8);
            auVar76._0_8_ = auVar74._8_8_;
            auVar76._8_4_ = auVar74._0_4_;
            auVar76._12_4_ = auVar74._4_4_;
            auVar162 = minps(auVar76,auVar74);
            auVar47._4_4_ = local_328._0_4_;
            auVar47._0_4_ = local_328._4_4_;
            auVar47._8_4_ = local_328._12_4_;
            auVar47._12_4_ = local_328._8_4_;
            auVar74 = minps(auVar47,local_328);
            auVar95._0_8_ = auVar74._8_8_;
            auVar95._8_4_ = auVar74._0_4_;
            auVar95._12_4_ = auVar74._4_4_;
            auVar75 = minps(auVar95,auVar74);
            auVar10._4_4_ = uStack_314;
            auVar10._0_4_ = local_318;
            auVar10._8_4_ = uStack_310;
            auVar10._12_4_ = uStack_30c;
            auVar48._4_4_ = local_318;
            auVar48._0_4_ = uStack_314;
            auVar48._8_4_ = uStack_30c;
            auVar48._12_4_ = uStack_310;
            auVar74 = minps(auVar48,auVar10);
            auVar49._0_8_ = auVar74._8_8_;
            auVar49._8_4_ = auVar74._0_4_;
            auVar49._12_4_ = auVar74._4_4_;
            auVar105._4_4_ = auVar75._0_4_;
            auVar105._0_4_ = auVar162._0_4_;
            auVar50._4_4_ = uVar139;
            auVar50._0_4_ = uVar140;
            auVar50._8_4_ = local_358.m128[3];
            auVar50._12_4_ = uVar180;
            auVar162 = maxps(auVar50,(undefined1  [16])local_358);
            auVar77._0_8_ = auVar162._8_8_;
            auVar77._8_4_ = auVar162._0_4_;
            auVar77._12_4_ = auVar162._4_4_;
            auVar75 = maxps(auVar77,auVar162);
            auVar51._4_4_ = uVar19;
            auVar51._0_4_ = uVar125;
            auVar51._8_4_ = local_348.m128[3];
            auVar51._12_4_ = uVar136;
            auVar162 = maxps(auVar51,(undefined1  [16])local_348);
            auVar96._0_8_ = auVar162._8_8_;
            auVar96._8_4_ = auVar162._0_4_;
            auVar96._12_4_ = auVar162._4_4_;
            auVar93 = maxps(auVar96,auVar162);
            auVar52._4_4_ = aVar110.m128[0];
            auVar52._0_4_ = aVar110.m128[1];
            auVar52._8_4_ = aVar110.m128[3];
            auVar52._12_4_ = aVar110.m128[2];
            auVar162 = maxps(auVar52,(undefined1  [16])aVar110);
            auVar53._0_8_ = auVar162._8_8_;
            auVar53._8_4_ = auVar162._0_4_;
            auVar53._12_4_ = auVar162._4_4_;
            auVar112._4_4_ = auVar93._0_4_;
            auVar112._0_4_ = auVar75._0_4_;
            lVar22 = 0;
            local_318 = 0x7f800000;
            uStack_314 = 0x7f800000;
            uStack_310 = 0x7f800000;
            uStack_30c = 0x7f800000;
            local_328._8_8_ = 0x7f8000007f800000;
            local_328._0_8_ = 0x7f8000007f800000;
            uStack_3a0 = 0x7f8000007f800000;
            local_3a8 = (undefined1  [8])0x7f8000007f800000;
            local_348.m128 = _DAT_01feba00;
            local_358.m128 = _DAT_01feba00;
            aVar110 = _DAT_01feba00;
            do {
              uVar19 = (uint)lVar22;
              lVar27 = lVar22 * 4;
              fVar102 = *(float *)(bezier_basis0 + lVar27 + 0x1dc);
              fVar34 = *(float *)(bezier_basis0 + lVar27 + 0x1e0);
              fVar121 = *(float *)(bezier_basis0 + lVar27 + 0x1e4);
              fVar122 = *(float *)(bezier_basis0 + lVar27 + 0x1e8);
              lVar27 = lVar22 * 4;
              fVar123 = *(float *)(bezier_basis0 + lVar27 + 0x660);
              fVar35 = *(float *)(bezier_basis0 + lVar27 + 0x664);
              fVar124 = *(float *)(bezier_basis0 + lVar27 + 0x668);
              fVar134 = *(float *)(bezier_basis0 + lVar27 + 0x66c);
              lVar27 = lVar22 * 4;
              fVar135 = *(float *)(bezier_basis0 + lVar27 + 0xae4);
              fVar36 = *(float *)(bezier_basis0 + lVar27 + 0xae8);
              fVar138 = *(float *)(bezier_basis0 + lVar27 + 0xaec);
              fVar142 = *(float *)(bezier_basis0 + lVar27 + 0xaf0);
              lVar27 = lVar22 * 4;
              fVar173 = *(float *)(bezier_basis0 + lVar27 + 0xf68);
              fVar176 = *(float *)(bezier_basis0 + lVar27 + 0xf6c);
              fVar169 = *(float *)(bezier_basis0 + lVar27 + 0xf70);
              fVar152 = *(float *)(bezier_basis0 + lVar27 + 0xf74);
              auVar54._0_4_ =
                   fVar37 * fVar102 + fVar70 * fVar123 + fVar33 * fVar135 + fVar38 * fVar173;
              auVar54._4_4_ = fVar37 * fVar34 + fVar70 * fVar35 + fVar33 * fVar36 + fVar38 * fVar176
              ;
              auVar54._8_4_ =
                   fVar37 * fVar121 + fVar70 * fVar124 + fVar33 * fVar138 + fVar38 * fVar169;
              auVar54._12_4_ =
                   fVar37 * fVar122 + fVar70 * fVar134 + fVar33 * fVar142 + fVar38 * fVar152;
              auVar104._0_4_ =
                   fVar64 * fVar102 + fVar84 * fVar123 + fVar133 * fVar135 + fVar65 * fVar173;
              auVar104._4_4_ =
                   fVar64 * fVar34 + fVar84 * fVar35 + fVar133 * fVar36 + fVar65 * fVar176;
              auVar104._8_4_ =
                   fVar64 * fVar121 + fVar84 * fVar124 + fVar133 * fVar138 + fVar65 * fVar169;
              auVar104._12_4_ =
                   fVar64 * fVar122 + fVar84 * fVar134 + fVar133 * fVar142 + fVar65 * fVar152;
              fVar157 = fVar102 * fVar66 + fVar123 * fVar87 + fVar135 * fVar137 + fVar173 * fVar67;
              fVar158 = fVar34 * fVar66 + fVar35 * fVar87 + fVar36 * fVar137 + fVar176 * fVar67;
              fVar161 = fVar121 * fVar66 + fVar124 * fVar87 + fVar138 * fVar137 + fVar169 * fVar67;
              fVar179 = fVar122 * fVar66 + fVar134 * fVar87 + fVar142 * fVar137 + fVar152 * fVar67;
              lVar27 = lVar22 * 4;
              fVar102 = *(float *)(bezier_basis0 + lVar27 + 0x13ec);
              fVar34 = *(float *)(bezier_basis0 + lVar27 + 0x13f0);
              fVar121 = *(float *)(bezier_basis0 + lVar27 + 0x13f4);
              fVar122 = *(float *)(bezier_basis0 + lVar27 + 0x13f8);
              lVar27 = lVar22 * 4;
              fVar123 = *(float *)(bezier_basis0 + lVar27 + 0x1870);
              fVar35 = *(float *)(bezier_basis0 + lVar27 + 0x1874);
              fVar124 = *(float *)(bezier_basis0 + lVar27 + 0x1878);
              fVar134 = *(float *)(bezier_basis0 + lVar27 + 0x187c);
              lVar27 = lVar22 * 4;
              fVar135 = *(float *)(bezier_basis0 + lVar27 + 0x1cf4);
              fVar36 = *(float *)(bezier_basis0 + lVar27 + 0x1cf8);
              fVar138 = *(float *)(bezier_basis0 + lVar27 + 0x1cfc);
              fVar142 = *(float *)(bezier_basis0 + lVar27 + 0x1d00);
              lVar27 = lVar22 * 4;
              fVar173 = *(float *)(bezier_basis0 + lVar27 + 0x2178);
              fVar176 = *(float *)(bezier_basis0 + lVar27 + 0x217c);
              fVar169 = *(float *)(bezier_basis0 + lVar27 + 0x2180);
              fVar152 = *(float *)(bezier_basis0 + lVar27 + 0x2184);
              fVar189 = fVar37 * fVar102 + fVar70 * fVar123 + fVar33 * fVar135 + fVar38 * fVar173;
              fVar190 = fVar37 * fVar34 + fVar70 * fVar35 + fVar33 * fVar36 + fVar38 * fVar176;
              fVar68 = fVar37 * fVar121 + fVar70 * fVar124 + fVar33 * fVar138 + fVar38 * fVar169;
              fVar69 = fVar37 * fVar122 + fVar70 * fVar134 + fVar33 * fVar142 + fVar38 * fVar152;
              fVar106 = fVar64 * fVar102 + fVar84 * fVar123 + fVar133 * fVar135 + fVar65 * fVar173;
              fVar115 = fVar64 * fVar34 + fVar84 * fVar35 + fVar133 * fVar36 + fVar65 * fVar176;
              fVar116 = fVar64 * fVar121 + fVar84 * fVar124 + fVar133 * fVar138 + fVar65 * fVar169;
              fVar117 = fVar64 * fVar122 + fVar84 * fVar134 + fVar133 * fVar142 + fVar65 * fVar152;
              fVar102 = fVar102 * fVar66 + fVar123 * fVar87 + fVar135 * fVar137 + fVar173 * fVar67;
              fVar34 = fVar34 * fVar66 + fVar35 * fVar87 + fVar36 * fVar137 + fVar176 * fVar67;
              fVar121 = fVar121 * fVar66 + fVar124 * fVar87 + fVar138 * fVar137 + fVar169 * fVar67;
              fVar122 = fVar122 * fVar66 + fVar134 * fVar87 + fVar142 * fVar137 + fVar152 * fVar67;
              uVar125 = -(uint)(uVar19 == 0);
              uVar136 = -(uint)(uVar19 == 1);
              uVar139 = -(uint)(uVar19 == 2);
              uVar140 = -(uint)(uVar19 == 3);
              uVar180 = -(uint)(uVar19 == 7);
              uVar183 = -(uint)(uVar19 == 6);
              uVar184 = -(uint)(uVar19 == 5);
              uVar185 = -(uint)(uVar19 == 4);
              auVar187 = minps(_local_3a8,auVar54);
              auVar186 = maxps((undefined1  [16])local_358,auVar54);
              auVar155._0_8_ =
                   CONCAT44(auVar54._4_4_ - (float)(~uVar136 & (uint)fVar190) * 0.055555556,
                            auVar54._0_4_ - (float)(~uVar125 & (uint)fVar189) * 0.055555556);
              auVar155._8_4_ = auVar54._8_4_ - (float)(~uVar139 & (uint)fVar68) * 0.055555556;
              auVar155._12_4_ = auVar54._12_4_ - (float)(~uVar140 & (uint)fVar69) * 0.055555556;
              auVar118._0_4_ = (float)(~uVar180 & (uint)fVar106) * 0.055555556 + auVar104._0_4_;
              auVar118._4_4_ = (float)(~uVar183 & (uint)fVar115) * 0.055555556 + auVar104._4_4_;
              auVar118._8_4_ = (float)(~uVar184 & (uint)fVar116) * 0.055555556 + auVar104._8_4_;
              auVar118._12_4_ = (float)(~uVar185 & (uint)fVar117) * 0.055555556 + auVar104._12_4_;
              auVar94 = minps(local_328,auVar104);
              auVar182 = maxps((undefined1  [16])local_348,auVar104);
              auVar111._0_8_ =
                   CONCAT44(auVar104._4_4_ - (float)(~uVar136 & (uint)fVar115) * 0.055555556,
                            auVar104._0_4_ - (float)(~uVar125 & (uint)fVar106) * 0.055555556);
              auVar111._8_4_ = auVar104._8_4_ - (float)(~uVar139 & (uint)fVar116) * 0.055555556;
              auVar111._12_4_ = auVar104._12_4_ - (float)(~uVar140 & (uint)fVar117) * 0.055555556;
              auVar164._0_4_ = -(uint)(-0x7ffffff9 < (int)(uVar19 ^ 0x80000000));
              auVar164._4_4_ = -(uint)(-0x7ffffff9 < (int)(uVar19 ^ 0x80000000));
              auVar164._8_4_ = -(uint)(-0x7ffffff9 < (int)(uVar19 ^ 0x80000000));
              auVar164._12_4_ = -(uint)(-0x7ffffff9 < (int)(uVar19 ^ 0x80000000));
              auVar14._4_4_ = fVar158;
              auVar14._0_4_ = fVar157;
              auVar14._8_4_ = fVar161;
              auVar14._12_4_ = fVar179;
              auVar171._0_4_ = (float)(~uVar180 & (uint)fVar102) * 0.055555556 + fVar157;
              auVar171._4_4_ = (float)(~uVar183 & (uint)fVar34) * 0.055555556 + fVar158;
              auVar171._8_4_ = (float)(~uVar184 & (uint)fVar121) * 0.055555556 + fVar161;
              auVar171._12_4_ = (float)(~uVar185 & (uint)fVar122) * 0.055555556 + fVar179;
              auVar11._4_4_ = uStack_314;
              auVar11._0_4_ = local_318;
              auVar11._8_4_ = uStack_310;
              auVar11._12_4_ = uStack_30c;
              auVar75 = minps(auVar11,auVar14);
              auVar93 = maxps((undefined1  [16])aVar110,auVar14);
              auVar192._0_8_ =
                   CONCAT44(fVar158 - (float)(~uVar136 & (uint)fVar34) * 0.055555556,
                            fVar157 - (float)(~uVar125 & (uint)fVar102) * 0.055555556);
              auVar192._8_4_ = fVar161 - (float)(~uVar139 & (uint)fVar121) * 0.055555556;
              auVar192._12_4_ = fVar179 - (float)(~uVar140 & (uint)fVar122) * 0.055555556;
              auVar127._8_4_ = auVar155._8_4_;
              auVar127._0_8_ = auVar155._0_8_;
              auVar127._12_4_ = auVar155._12_4_;
              auVar13._4_4_ = (float)(~uVar183 & (uint)fVar190) * 0.055555556 + auVar54._4_4_;
              auVar13._0_4_ = (float)(~uVar180 & (uint)fVar189) * 0.055555556 + auVar54._0_4_;
              auVar13._8_4_ = (float)(~uVar184 & (uint)fVar68) * 0.055555556 + auVar54._8_4_;
              auVar13._12_4_ = (float)(~uVar185 & (uint)fVar69) * 0.055555556 + auVar54._12_4_;
              auVar188 = minps(auVar127,auVar13);
              auVar187 = minps(auVar187,auVar188);
              auVar128._8_4_ = auVar111._8_4_;
              auVar128._0_8_ = auVar111._0_8_;
              auVar128._12_4_ = auVar111._12_4_;
              auVar188 = minps(auVar128,auVar118);
              auVar94 = minps(auVar94,auVar188);
              auVar129._8_4_ = auVar192._8_4_;
              auVar129._0_8_ = auVar192._0_8_;
              auVar129._12_4_ = auVar192._12_4_;
              auVar188 = minps(auVar129,auVar171);
              auVar75 = minps(auVar75,auVar188);
              _local_3a8 = _local_3a8 & auVar164 | ~auVar164 & auVar187;
              auVar146._0_4_ = local_328._0_4_ & auVar164._0_4_;
              auVar146._4_4_ = local_328._4_4_ & auVar164._4_4_;
              auVar146._8_4_ = local_328._8_4_ & auVar164._8_4_;
              auVar146._12_4_ = local_328._12_4_ & auVar164._12_4_;
              local_328 = auVar146 | ~auVar164 & auVar94;
              local_318 = local_318 & auVar164._0_4_ | ~auVar164._0_4_ & auVar75._0_4_;
              uStack_314 = uStack_314 & auVar164._4_4_ | ~auVar164._4_4_ & auVar75._4_4_;
              uStack_310 = uStack_310 & auVar164._8_4_ | ~auVar164._8_4_ & auVar75._8_4_;
              uStack_30c = uStack_30c & auVar164._12_4_ | ~auVar164._12_4_ & auVar75._12_4_;
              auVar75 = maxps(auVar155,auVar13);
              auVar94 = maxps(auVar186,auVar75);
              auVar75 = maxps(auVar111,auVar118);
              auVar186 = maxps(auVar182,auVar75);
              auVar75 = maxps(auVar192,auVar171);
              auVar75 = maxps(auVar93,auVar75);
              uVar19 = (uint)local_358.m128[0] & auVar164._0_4_ | ~auVar164._0_4_ & auVar94._0_4_;
              uVar125 = (uint)local_358.m128[1] & auVar164._4_4_ | ~auVar164._4_4_ & auVar94._4_4_;
              uVar136 = (uint)local_358.m128[2] & auVar164._8_4_ | ~auVar164._8_4_ & auVar94._8_4_;
              local_358.m128[3] =
                   (float)((uint)local_358.m128[3] & auVar164._12_4_ |
                          ~auVar164._12_4_ & auVar94._12_4_);
              local_358.m128[1] = (float)uVar125;
              local_358.m128[0] = (float)uVar19;
              local_358.m128[2] = (float)uVar136;
              uVar139 = (uint)local_348.m128[0] & auVar164._0_4_ | ~auVar164._0_4_ & auVar186._0_4_;
              uVar140 = (uint)local_348.m128[1] & auVar164._4_4_ | ~auVar164._4_4_ & auVar186._4_4_;
              uVar180 = (uint)local_348.m128[2] & auVar164._8_4_ | ~auVar164._8_4_ & auVar186._8_4_;
              local_348.m128[3] =
                   (float)((uint)local_348.m128[3] & auVar164._12_4_ |
                          ~auVar164._12_4_ & auVar186._12_4_);
              local_348.m128[1] = (float)uVar140;
              local_348.m128[0] = (float)uVar139;
              local_348.m128[2] = (float)uVar180;
              local_388 = aVar110.m128[0];
              fStack_384 = aVar110.m128[1];
              fStack_380 = aVar110.m128[2];
              fStack_37c = aVar110.m128[3];
              auVar55._0_4_ = (uint)local_388 & auVar164._0_4_;
              auVar55._4_4_ = (uint)fStack_384 & auVar164._4_4_;
              auVar55._8_4_ = (uint)fStack_380 & auVar164._8_4_;
              auVar55._12_4_ = (uint)fStack_37c & auVar164._12_4_;
              auVar165._0_4_ = ~auVar164._0_4_ & auVar75._0_4_;
              auVar165._4_4_ = ~auVar164._4_4_ & auVar75._4_4_;
              auVar165._8_4_ = ~auVar164._8_4_ & auVar75._8_4_;
              auVar165._12_4_ = ~auVar164._12_4_ & auVar75._12_4_;
              aVar110 = (anon_union_16_2_47237d3f_for_Vec3fa_0)(auVar165 | auVar55);
              lVar22 = lVar22 + 4;
            } while (lVar22 == 4);
            auVar74 = minps(auVar49,auVar74);
            auVar105._8_4_ = auVar74._0_4_;
            auVar105._12_4_ = 0;
            auVar74 = maxps(auVar53,auVar162);
            auVar112._8_4_ = auVar74._0_4_;
            auVar112._12_4_ = 0;
            auVar56._4_4_ = local_3a8._0_4_;
            auVar56._0_4_ = local_3a8._4_4_;
            auVar56._8_4_ = local_3a8._12_4_;
            auVar56._12_4_ = local_3a8._8_4_;
            auVar74 = minps(auVar56,_local_3a8);
            auVar78._0_8_ = auVar74._8_8_;
            auVar78._8_4_ = auVar74._0_4_;
            auVar78._12_4_ = auVar74._4_4_;
            auVar162 = minps(auVar78,auVar74);
            auVar57._4_4_ = local_328._0_4_;
            auVar57._0_4_ = local_328._4_4_;
            auVar57._8_4_ = local_328._12_4_;
            auVar57._12_4_ = local_328._8_4_;
            auVar74 = minps(auVar57,local_328);
            auVar97._0_8_ = auVar74._8_8_;
            auVar97._8_4_ = auVar74._0_4_;
            auVar97._12_4_ = auVar74._4_4_;
            auVar75 = minps(auVar97,auVar74);
            auVar12._4_4_ = uStack_314;
            auVar12._0_4_ = local_318;
            auVar12._8_4_ = uStack_310;
            auVar12._12_4_ = uStack_30c;
            auVar58._4_4_ = local_318;
            auVar58._0_4_ = uStack_314;
            auVar58._8_4_ = uStack_30c;
            auVar58._12_4_ = uStack_310;
            auVar74 = minps(auVar58,auVar12);
            auVar79._0_8_ = auVar74._8_8_;
            auVar79._8_4_ = auVar74._0_4_;
            auVar79._12_4_ = auVar74._4_4_;
            auVar74 = minps(auVar79,auVar74);
            auVar98._4_4_ = auVar75._0_4_;
            auVar98._0_4_ = auVar162._0_4_;
            auVar98._8_4_ = auVar74._0_4_;
            auVar98._12_4_ = 0;
            auVar93 = minps(auVar105,auVar98);
            auVar59._4_4_ = uVar19;
            auVar59._0_4_ = uVar125;
            auVar59._8_4_ = local_358.m128[3];
            auVar59._12_4_ = uVar136;
            auVar74 = maxps(auVar59,(undefined1  [16])local_358);
            auVar80._0_8_ = auVar74._8_8_;
            auVar80._8_4_ = auVar74._0_4_;
            auVar80._12_4_ = auVar74._4_4_;
            auVar162 = maxps(auVar80,auVar74);
            auVar60._4_4_ = uVar139;
            auVar60._0_4_ = uVar140;
            auVar60._8_4_ = local_348.m128[3];
            auVar60._12_4_ = uVar180;
            auVar74 = maxps(auVar60,(undefined1  [16])local_348);
            auVar99._0_8_ = auVar74._8_8_;
            auVar99._8_4_ = auVar74._0_4_;
            auVar99._12_4_ = auVar74._4_4_;
            auVar75 = maxps(auVar99,auVar74);
            auVar61._4_4_ = aVar110.m128[0];
            auVar61._0_4_ = aVar110.m128[1];
            auVar61._8_4_ = aVar110.m128[3];
            auVar61._12_4_ = aVar110.m128[2];
            auVar74 = maxps(auVar61,(undefined1  [16])aVar110);
            auVar81._0_8_ = auVar74._8_8_;
            auVar81._8_4_ = auVar74._0_4_;
            auVar81._12_4_ = auVar74._4_4_;
            auVar74 = maxps(auVar81,auVar74);
            auVar100._4_4_ = auVar75._0_4_;
            auVar100._0_4_ = auVar162._0_4_;
            auVar100._8_4_ = auVar74._0_4_;
            auVar100._12_4_ = 0;
            auVar74 = maxps(auVar112,auVar100);
            auVar113._0_4_ = -(uint)(auVar74._0_4_ < fVar31 && -1.844e+18 < auVar93._0_4_);
            auVar113._4_4_ = -(uint)(auVar74._4_4_ < fVar92 && -1.844e+18 < auVar93._4_4_);
            auVar113._8_4_ = -(uint)(auVar74._8_4_ < fVar107 && -1.844e+18 < auVar93._8_4_);
            auVar113._12_4_ = -(uint)(auVar74._12_4_ < fVar159 && -1.844e+18 < auVar93._12_4_);
            uVar24 = movmskps((int)lVar18,auVar113);
            if ((~(byte)uVar24 & 7) != 0) goto LAB_00ab6d23;
            uVar20 = uVar20 + 1;
            bVar30 = (ulong)(long)(int)uVar21 < uVar20;
          } while (uVar20 <= (ulong)(long)(int)uVar21);
        }
        local_f0.primID = &local_e0;
        fVar32 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
                 super_Geometry.time_range.lower;
        fVar31 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
                 super_Geometry.time_range.upper - fVar32;
        fVar92 = (fVar40 - fVar32) / fVar31;
        fVar31 = (fVar39 - fVar32) / fVar31;
        fVar39 = fVar16 * fVar92;
        fVar107 = fVar16 * fVar31;
        local_f0.this = this;
        local_e0 = uVar29;
        fVar40 = floorf(fVar39);
        fVar32 = ceilf(fVar107);
        uVar26 = (uint)fVar40;
        if (fVar40 <= 0.0) {
          fVar40 = 0.0;
        }
        fVar159 = fVar32;
        if (fVar16 <= fVar32) {
          fVar159 = fVar16;
        }
        if ((int)uVar26 < 0) {
          uVar26 = 0xffffffff;
        }
        iVar23 = (int)fVar16 + 1;
        if ((int)fVar32 < (int)fVar16 + 1) {
          iVar23 = (int)fVar32;
        }
        linearBounds::anon_class_16_2_07cfa4d6::operator()
                  ((BBox3fa *)&local_b8.field_1,&local_f0,(long)(int)fVar40);
        linearBounds::anon_class_16_2_07cfa4d6::operator()
                  ((BBox3fa *)&local_d8.field_1,&local_f0,(long)(int)fVar159);
        if (iVar23 - uVar26 == 1) {
          fVar16 = fVar39 - fVar40;
          if (fVar39 - fVar40 <= 0.0) {
            fVar16 = 0.0;
          }
          fVar40 = 1.0 - fVar16;
          auVar143._0_4_ = fVar40 * local_b8.m128[0] + fVar16 * local_d8.m128[0];
          auVar143._4_4_ = fVar40 * local_b8.m128[1] + fVar16 * local_d8.m128[1];
          auVar143._8_4_ = fVar40 * local_b8.m128[2] + fVar16 * local_d8.m128[2];
          auVar126._0_4_ = fVar40 * local_a8 + fVar16 * local_c8;
          auVar126._4_4_ = fVar40 * fStack_a4 + fVar16 * fStack_c4;
          auVar126._8_4_ = fVar40 * fStack_a0 + fVar16 * fStack_c0;
          fVar16 = fVar159 - fVar107;
          if (fVar159 - fVar107 <= 0.0) {
            fVar16 = 0.0;
          }
          fVar40 = 1.0 - fVar16;
          auVar41._0_4_ = local_d8.m128[0] * fVar40 + local_b8.m128[0] * fVar16;
          auVar41._4_4_ = local_d8.m128[1] * fVar40 + local_b8.m128[1] * fVar16;
          auVar41._8_4_ = local_d8.m128[2] * fVar40 + local_b8.m128[2] * fVar16;
          auVar73._0_4_ = fVar40 * local_c8 + fVar16 * local_a8;
          auVar73._4_4_ = fVar40 * fStack_c4 + fVar16 * fStack_a4;
          auVar73._8_4_ = fVar40 * fStack_c0 + fVar16 * fStack_a0;
        }
        else {
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_58.field_1,&local_f0,(long)((int)fVar40 + 1));
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_78.field_1,&local_f0,(long)((int)fVar159 + -1));
          fVar32 = fVar39 - fVar40;
          if (fVar39 - fVar40 <= 0.0) {
            fVar32 = 0.0;
          }
          fVar40 = 1.0 - fVar32;
          auVar143._0_4_ = local_b8.m128[0] * fVar40 + local_58.m128[0] * fVar32;
          auVar143._4_4_ = local_b8.m128[1] * fVar40 + local_58.m128[1] * fVar32;
          auVar143._8_4_ = local_b8.m128[2] * fVar40 + local_58.m128[2] * fVar32;
          auVar147._12_4_ = local_b8.m128[3] * fVar40 + local_58.m128[3] * fVar32;
          auVar147._0_12_ = auVar143;
          auVar126._0_4_ = fVar40 * local_a8 + fVar32 * local_48;
          auVar126._4_4_ = fVar40 * fStack_a4 + fVar32 * fStack_44;
          auVar126._8_4_ = fVar40 * fStack_a0 + fVar32 * fStack_40;
          auVar130._12_4_ = fVar40 * fStack_9c + fVar32 * fStack_3c;
          auVar130._0_12_ = auVar126;
          fVar40 = fVar159 - fVar107;
          if (fVar159 - fVar107 <= 0.0) {
            fVar40 = 0.0;
          }
          fVar39 = 1.0 - fVar40;
          auVar156._0_8_ =
               CONCAT44(local_d8.m128[1] * fVar39 + local_78.m128[1] * fVar40,
                        local_d8.m128[0] * fVar39 + local_78.m128[0] * fVar40);
          auVar156._8_4_ = local_d8.m128[2] * fVar39 + local_78.m128[2] * fVar40;
          auVar156._12_4_ = local_d8.m128[3] * fVar39 + local_78.m128[3] * fVar40;
          auVar119._0_8_ =
               CONCAT44(fVar39 * fStack_c4 + fVar40 * fStack_64,
                        fVar39 * local_c8 + fVar40 * local_68);
          auVar119._8_4_ = fVar39 * fStack_c0 + fVar40 * fStack_60;
          auVar119._12_4_ = fVar39 * fStack_bc + fVar40 * fStack_5c;
          if ((int)(uVar26 + 1) < iVar23) {
            sVar28 = (size_t)(uVar26 + 1);
            iVar23 = ~uVar26 + iVar23;
            do {
              fVar40 = ((float)(int)sVar28 / fVar16 - fVar92) / (fVar31 - fVar92);
              fVar32 = 1.0 - fVar40;
              fVar39 = auVar156._12_4_;
              fVar107 = auVar119._12_4_;
              linearBounds::anon_class_16_2_07cfa4d6::operator()
                        ((BBox3fa *)&local_98.field_1,&local_f0,sVar28);
              auVar62._0_4_ = local_98.m128[0] - (auVar147._0_4_ * fVar32 + auVar156._0_4_ * fVar40)
              ;
              auVar62._4_4_ = local_98.m128[1] - (auVar147._4_4_ * fVar32 + auVar156._4_4_ * fVar40)
              ;
              auVar62._8_4_ = local_98.m128[2] - (auVar147._8_4_ * fVar32 + auVar156._8_4_ * fVar40)
              ;
              auVar62._12_4_ = local_98.m128[3] - (auVar147._12_4_ * fVar32 + fVar39 * fVar40);
              auVar82._0_4_ = local_88 - (fVar32 * auVar130._0_4_ + fVar40 * auVar119._0_4_);
              auVar82._4_4_ = fStack_84 - (fVar32 * auVar130._4_4_ + fVar40 * auVar119._4_4_);
              auVar82._8_4_ = fStack_80 - (fVar32 * auVar130._8_4_ + fVar40 * auVar119._8_4_);
              auVar82._12_4_ = fStack_7c - (fVar32 * auVar130._12_4_ + fVar40 * fVar107);
              auVar74 = minps(auVar62,ZEXT816(0));
              auVar162 = maxps(auVar82,ZEXT816(0));
              auVar143._0_4_ = auVar147._0_4_ + auVar74._0_4_;
              auVar143._4_4_ = auVar147._4_4_ + auVar74._4_4_;
              auVar143._8_4_ = auVar147._8_4_ + auVar74._8_4_;
              auVar147._12_4_ = auVar147._12_4_ + auVar74._12_4_;
              auVar147._0_12_ = auVar143;
              auVar41._0_8_ =
                   CONCAT44(auVar74._4_4_ + auVar156._4_4_,auVar74._0_4_ + auVar156._0_4_);
              auVar41._8_4_ = auVar74._8_4_ + auVar156._8_4_;
              auVar126._0_4_ = auVar130._0_4_ + auVar162._0_4_;
              auVar126._4_4_ = auVar130._4_4_ + auVar162._4_4_;
              auVar126._8_4_ = auVar130._8_4_ + auVar162._8_4_;
              auVar130._12_4_ = auVar130._12_4_ + auVar162._12_4_;
              auVar130._0_12_ = auVar126;
              auVar73._0_8_ =
                   CONCAT44(auVar162._4_4_ + auVar119._4_4_,auVar162._0_4_ + auVar119._0_4_);
              auVar73._8_4_ = auVar162._8_4_ + auVar119._8_4_;
              sVar28 = sVar28 + 1;
              auVar119._8_4_ = auVar73._8_4_;
              auVar119._0_8_ = auVar73._0_8_;
              auVar119._12_4_ = auVar162._12_4_ + fVar107;
              auVar156._8_4_ = auVar41._8_4_;
              auVar156._0_8_ = auVar41._0_8_;
              auVar156._12_4_ = auVar74._12_4_ + fVar39;
              iVar23 = iVar23 + -1;
            } while (iVar23 != 0);
          }
          else {
            auVar41._8_4_ = auVar156._8_4_;
            auVar41._0_8_ = auVar156._0_8_;
            auVar73._8_4_ = auVar119._8_4_;
            auVar73._0_8_ = auVar119._0_8_;
          }
        }
        fVar16 = (float)((this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                         super_CurveGeometry.super_Geometry.numTimeSteps - 1);
        uVar17 = (ulong)(uint)fVar16;
        aVar148.m128[3] = (float)geomID;
        aVar148._0_12_ = auVar143;
        aVar131.m128[3] = (float)uVar29;
        aVar131._0_12_ = auVar126;
        aVar63.m128[3] = fVar16;
        aVar63._0_12_ = auVar41;
        aVar83.m128[3] = fVar16;
        aVar83._0_12_ = auVar73;
        auVar101._0_4_ =
             auVar126._0_4_ * 0.5 + auVar73._0_4_ * 0.5 + auVar143._0_4_ * 0.5 + auVar41._0_4_ * 0.5
        ;
        auVar101._4_4_ =
             auVar126._4_4_ * 0.5 + auVar73._4_4_ * 0.5 + auVar143._4_4_ * 0.5 + auVar41._4_4_ * 0.5
        ;
        auVar101._8_4_ =
             auVar126._8_4_ * 0.5 + auVar73._8_4_ * 0.5 + auVar143._8_4_ * 0.5 + auVar41._8_4_ * 0.5
        ;
        auVar101._12_4_ = (float)uVar29 * 0.5 + fVar16 * 0.5 + (float)geomID * 0.5 + fVar16 * 0.5;
        BVar3 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
                super_Geometry.time_range;
        local_228.m128 = (__m128)minps(local_228.m128,aVar148.m128);
        local_288 = local_288 + 1;
        local_280 = local_280 + uVar17;
        bVar30 = local_2f8 < uVar17;
        if (local_2f8 <= uVar17) {
          local_2f8 = uVar17;
        }
        pPVar7 = prims->items;
        pPVar7[local_278].lbounds.bounds0.lower.field_0 = aVar148;
        local_238.m128 = (__m128)maxps(local_238.m128,aVar131.m128);
        pPVar7[local_278].lbounds.bounds0.upper.field_0 = aVar131;
        aVar132.m128 = (__m128)minps(aVar132.m128,aVar63.m128);
        pPVar7[local_278].lbounds.bounds1.lower.field_0 = aVar63;
        aVar120.m128 = (__m128)maxps(aVar120.m128,aVar83.m128);
        pPVar7[local_278].lbounds.bounds1.upper.field_0 = aVar83;
        pPVar7[local_278].time_range = BVar3;
        aVar114.m128 = (__m128)minps(aVar114.m128,auVar101);
        local_248.m128 = (__m128)maxps(local_248.m128,auVar101);
        fVar16 = BVar3.lower;
        if (fVar16 <= local_390) {
          local_390 = fVar16;
        }
        fVar39 = BVar3.upper;
        fVar40 = fVar39;
        if (fVar39 <= local_38c) {
          fVar40 = local_38c;
        }
        uVar26 = (int)((uint)bVar30 << 0x1f) >> 0x1f;
        uVar19 = (int)((uint)bVar30 << 0x1f) >> 0x1f;
        local_278 = local_278 + 1;
        local_218.upper = (float)(~uVar19 & (uint)local_218.upper | (uint)fVar39 & uVar19);
        local_218.lower = (float)(~uVar26 & (uint)local_218.lower | (uint)fVar16 & uVar26);
        local_38c = fVar40;
      }
LAB_00ab72b0:
      uVar29 = uVar29 + 1;
    } while (uVar29 < r->_end);
    (__return_storage_ptr__->object_range)._end = local_288;
  }
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = local_228;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = local_238;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = aVar132;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = aVar120;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = aVar114;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = local_248;
  (__return_storage_ptr__->time_range).lower = local_390;
  (__return_storage_ptr__->time_range).upper = local_38c;
  __return_storage_ptr__->num_time_segments = local_280;
  __return_storage_ptr__->max_num_time_segments = local_2f8;
  __return_storage_ptr__->max_time_range = local_218;
  return __return_storage_ptr__;
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims, const BBox1f& t0t1, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfoMB pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbox = linearBounds(j,t0t1);
          const PrimRefMB prim(lbox,this->numTimeSegments(),this->time_range,this->numTimeSegments(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }